

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

void protect_up(refs_table_t *tbl,uint64_t a)

{
  long lVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  int iVar4;
  int local_34;
  int i;
  uint64_t v;
  uint64_t *ts_bucket;
  uint64_t *bucket;
  uint64_t a_local;
  refs_table_t *tbl_local;
  
  protect_enter(tbl);
LAB_001200dc:
  do {
    puVar2 = tbl->refs_table;
    uVar3 = sylvan_fnvhash8(a,0xcbf29ce484222325);
    ts_bucket = puVar2 + (uVar3 & tbl->refs_size - 1);
    v = 0;
    local_34 = 0x80;
    while (iVar4 = local_34 + -1, local_34 != 0) {
      while (*ts_bucket != 0x7fffffffffffffff) {
        if (*ts_bucket != 0) goto LAB_0012023d;
        if (v != 0) {
          LOCK();
          lVar1 = *(long *)v;
          if (lVar1 == 0x7fffffffffffffff) {
            *(uint64_t *)v = a;
          }
          UNLOCK();
          if (lVar1 == 0x7fffffffffffffff) {
            protect_leave(tbl);
            return;
          }
          goto LAB_001200dc;
        }
        LOCK();
        uVar3 = *ts_bucket;
        if (uVar3 == 0) {
          *ts_bucket = a;
        }
        UNLOCK();
        if (uVar3 == 0) {
          protect_leave(tbl);
          return;
        }
      }
      if (v == 0) {
        v = (uint64_t)ts_bucket;
      }
LAB_0012023d:
      ts_bucket = ts_bucket + 1;
      local_34 = iVar4;
      if (ts_bucket == tbl->refs_table + tbl->refs_size) {
        ts_bucket = tbl->refs_table;
      }
    }
    if (v == 0) {
      protect_leave(tbl);
      protect_resize(tbl);
      protect_enter(tbl);
    }
    else {
      LOCK();
      lVar1 = *(long *)v;
      if (lVar1 == 0x7fffffffffffffff) {
        *(uint64_t *)v = a;
      }
      UNLOCK();
      if (lVar1 == 0x7fffffffffffffff) {
        protect_leave(tbl);
        return;
      }
    }
  } while( true );
}

Assistant:

void
protect_up(refs_table_t *tbl, uint64_t a)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v;
    int i;

    protect_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // go go go
            if (ts_bucket != NULL) {
                v = refs_ts;
                if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_retry;
                }
            } else {
                if (atomic_compare_exchange_weak(bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_restart;
                }
            }
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (ts_bucket != NULL) {
        v = refs_ts;
        if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
            protect_leave(tbl);
            return;
        } else {
            goto ref_retry;
        }
    } else {
        // hash table full
        protect_leave(tbl);
        protect_resize(tbl);
        protect_enter(tbl);
        goto ref_retry;
    }
}